

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O1

FT_Error tt_cmap4_validate(FT_Byte *table,FT_Validator valid)

{
  byte bVar1;
  byte bVar2;
  FT_Byte FVar3;
  byte bVar4;
  undefined2 uVar5;
  ushort uVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  byte *pbVar12;
  ushort *puVar13;
  byte *pbVar14;
  ulong uVar15;
  FT_Byte *pFVar16;
  ushort *puVar17;
  uint uVar18;
  ushort *puVar19;
  uint uVar20;
  byte *pbVar21;
  ulong uVar22;
  int local_58;
  uint local_48;
  uint local_34;
  
  if (valid->limit < table + 4) {
    ft_validator_error(valid,8);
  }
  uVar15 = (ulong)(ushort)(*(ushort *)(table + 2) << 8 | *(ushort *)(table + 2) >> 8);
  if (valid->limit < table + uVar15) {
    if (valid->level != FT_VALIDATE_DEFAULT) {
      ft_validator_error(valid,8);
    }
    uVar15 = (ulong)(uint)((int)valid->limit - (int)table);
  }
  if ((uint)uVar15 < 0x10) {
    ft_validator_error(valid,8);
  }
  bVar1 = table[6];
  uVar11 = (uint)bVar1 * 0x100;
  bVar2 = table[7];
  uVar20 = uVar11 + bVar2;
  if ((bVar2 & 1) != 0 && FT_VALIDATE_TIGHT < valid->level) {
    ft_validator_error(valid,8);
  }
  uVar18 = uVar20 & 0xfffffffe;
  if ((uint)uVar15 < uVar18 * 4 + 0x10) {
    ft_validator_error(valid,8);
  }
  uVar8 = uVar20 >> 1;
  if (FT_VALIDATE_TIGHT < valid->level) {
    uVar6 = CONCAT11(table[8],table[9]);
    uVar5 = *(undefined2 *)(table + 10);
    FVar3 = table[0xc];
    bVar4 = table[0xd];
    if (((table[9] | bVar4) & 1) != 0) {
      ft_validator_error(valid,8);
    }
    uVar9 = (uint)(uVar6 >> 1);
    if ((((uVar8 < uVar9) || ((uVar6 & 0xfffffffe) < uVar8)) ||
        ((ushort)(CONCAT11(FVar3,bVar4) >> 1) + uVar9 != uVar8)) ||
       (uVar9 != 1 << ((byte)((ushort)uVar5 >> 8) & 0x1f))) {
      ft_validator_error(valid,8);
    }
  }
  puVar13 = (ushort *)(table + 0xe);
  if ((FT_VALIDATE_TIGHT < valid->level) &&
     (uVar6 = *(ushort *)((long)puVar13 + (ulong)(uVar18 - 2)),
     (ushort)(uVar6 << 8 | uVar6 >> 8) != 0xffff)) {
    ft_validator_error(valid,8);
  }
  local_48 = 0;
  if (1 < uVar20) {
    uVar22 = (ulong)uVar18;
    puVar19 = (ushort *)(table + uVar22 * 2 + 0x10);
    pbVar21 = (byte *)((long)puVar19 + uVar22);
    puVar17 = (ushort *)(table + uVar22 + 0x10);
    pbVar14 = pbVar21 + uVar22;
    uVar20 = (uVar11 | bVar2) >> 1;
    pFVar16 = table + (ulong)(ushort)(CONCAT11(bVar1,bVar2) >> 1) * 6 + 0x11;
    local_34 = 0;
    local_58 = 0;
    local_48 = 0;
    uVar11 = 0;
    do {
      uVar7 = *puVar17 << 8 | *puVar17 >> 8;
      uVar9 = (uint)(ushort)(*puVar13 << 8 | *puVar13 >> 8);
      uVar6 = *puVar19;
      bVar1 = *pbVar21;
      bVar2 = pbVar21[1];
      uVar18 = (uint)uVar7;
      iVar10 = uVar9 - uVar7;
      if (uVar9 < uVar18) {
        ft_validator_error(valid,8);
      }
      if ((local_58 != 0) && (uVar18 <= uVar11)) {
        if (valid->level == FT_VALIDATE_DEFAULT) {
          if ((uVar18 < local_34) || (uVar9 < uVar11)) {
            local_48 = local_48 | 1;
          }
          else {
            local_48 = local_48 | 2;
          }
        }
        else {
          ft_validator_error(valid,8);
        }
      }
      uVar11 = (uint)bVar1 * 0x100 + (uint)bVar2;
      if (uVar11 != 0) {
        if (uVar11 == 0xffff) {
          if ((((FT_VALIDATE_TIGHT < valid->level) || (local_58 != uVar8 - 1)) || (uVar18 != 0xffff)
              ) || (uVar9 != 0xffff)) {
            ft_validator_error(valid,8);
          }
        }
        else {
          pbVar12 = pbVar21 + uVar11;
          if (valid->level == FT_VALIDATE_DEFAULT) {
            if ((((local_58 != uVar8 - 1) || (uVar18 != 0xffff)) || (uVar9 != 0xffff)) &&
               ((pbVar12 < pbVar14 || (valid->limit < pbVar12 + (iVar10 * 2 + 2)))))
            goto LAB_00219574;
          }
          else if ((pbVar12 < pbVar14) || (table + uVar15 < pbVar12 + (iVar10 * 2 + 2))) {
LAB_00219574:
            ft_validator_error(valid,8);
          }
          if ((valid->level != FT_VALIDATE_DEFAULT) && (uVar18 < uVar9)) {
            uVar22 = (ulong)((uint)bVar1 * 0x100 + (uint)bVar2);
            uVar11 = uVar18;
            do {
              if ((CONCAT11(pbVar21[uVar22],pFVar16[uVar22]) != 0) &&
                 ((uint)valid[1].jump_buffer[0].__jmpbuf[0] <=
                  (uint)(ushort)(CONCAT11(pbVar21[uVar22],pFVar16[uVar22]) +
                                (uVar6 << 8 | uVar6 >> 8)))) {
                ft_validator_error(valid,0x10);
              }
              uVar11 = uVar11 + 1;
              uVar22 = uVar22 + 2;
            } while (uVar11 < uVar9);
          }
        }
      }
      puVar17 = puVar17 + 1;
      puVar13 = puVar13 + 1;
      puVar19 = puVar19 + 1;
      pbVar21 = pbVar21 + 2;
      local_58 = local_58 + 1;
      pFVar16 = pFVar16 + 2;
      uVar11 = uVar9;
      local_34 = uVar18;
    } while (local_58 != uVar20 + (uVar20 == 0));
  }
  return local_48;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  tt_cmap4_validate( FT_Byte*      table,
                     FT_Validator  valid )
  {
    FT_Byte*  p;
    FT_UInt   length;

    FT_Byte   *ends, *starts, *offsets, *deltas, *glyph_ids;
    FT_UInt   num_segs;
    FT_Error  error = FT_Err_Ok;


    if ( table + 2 + 2 > valid->limit )
      FT_INVALID_TOO_SHORT;

    p      = table + 2;           /* skip format */
    length = TT_NEXT_USHORT( p );

    /* in certain fonts, the `length' field is invalid and goes */
    /* out of bound.  We try to correct this here...            */
    if ( table + length > valid->limit )
    {
      if ( valid->level >= FT_VALIDATE_TIGHT )
        FT_INVALID_TOO_SHORT;

      length = (FT_UInt)( valid->limit - table );
    }

    if ( length < 16 )
      FT_INVALID_TOO_SHORT;

    p        = table + 6;
    num_segs = TT_NEXT_USHORT( p );   /* read segCountX2 */

    if ( valid->level >= FT_VALIDATE_PARANOID )
    {
      /* check that we have an even value here */
      if ( num_segs & 1 )
        FT_INVALID_DATA;
    }

    num_segs /= 2;

    if ( length < 16 + num_segs * 2 * 4 )
      FT_INVALID_TOO_SHORT;

    /* check the search parameters - even though we never use them */
    /*                                                             */
    if ( valid->level >= FT_VALIDATE_PARANOID )
    {
      /* check the values of `searchRange', `entrySelector', `rangeShift' */
      FT_UInt  search_range   = TT_NEXT_USHORT( p );
      FT_UInt  entry_selector = TT_NEXT_USHORT( p );
      FT_UInt  range_shift    = TT_NEXT_USHORT( p );


      if ( ( search_range | range_shift ) & 1 )  /* must be even values */
        FT_INVALID_DATA;

      search_range /= 2;
      range_shift  /= 2;

      /* `search range' is the greatest power of 2 that is <= num_segs */

      if ( search_range                > num_segs                 ||
           search_range * 2            < num_segs                 ||
           search_range + range_shift != num_segs                 ||
           search_range               != ( 1U << entry_selector ) )
        FT_INVALID_DATA;
    }

    ends      = table   + 14;
    starts    = table   + 16 + num_segs * 2;
    deltas    = starts  + num_segs * 2;
    offsets   = deltas  + num_segs * 2;
    glyph_ids = offsets + num_segs * 2;

    /* check last segment; its end count value must be 0xFFFF */
    if ( valid->level >= FT_VALIDATE_PARANOID )
    {
      p = ends + ( num_segs - 1 ) * 2;
      if ( TT_PEEK_USHORT( p ) != 0xFFFFU )
        FT_INVALID_DATA;
    }

    {
      FT_UInt   start, end, offset, n;
      FT_UInt   last_start = 0, last_end = 0;
      FT_Int    delta;
      FT_Byte*  p_start   = starts;
      FT_Byte*  p_end     = ends;
      FT_Byte*  p_delta   = deltas;
      FT_Byte*  p_offset  = offsets;


      for ( n = 0; n < num_segs; n++ )
      {
        p      = p_offset;
        start  = TT_NEXT_USHORT( p_start );
        end    = TT_NEXT_USHORT( p_end );
        delta  = TT_NEXT_SHORT( p_delta );
        offset = TT_NEXT_USHORT( p_offset );

        if ( start > end )
          FT_INVALID_DATA;

        /* this test should be performed at default validation level; */
        /* unfortunately, some popular Asian fonts have overlapping   */
        /* ranges in their charmaps                                   */
        /*                                                            */
        if ( start <= last_end && n > 0 )
        {
          if ( valid->level >= FT_VALIDATE_TIGHT )
            FT_INVALID_DATA;
          else
          {
            /* allow overlapping segments, provided their start points */
            /* and end points, respectively, are in ascending order    */
            /*                                                         */
            if ( last_start > start || last_end > end )
              error |= TT_CMAP_FLAG_UNSORTED;
            else
              error |= TT_CMAP_FLAG_OVERLAPPING;
          }
        }

        if ( offset && offset != 0xFFFFU )
        {
          p += offset;  /* start of glyph ID array */

          /* check that we point within the glyph IDs table only */
          if ( valid->level >= FT_VALIDATE_TIGHT )
          {
            if ( p < glyph_ids                                ||
                 p + ( end - start + 1 ) * 2 > table + length )
              FT_INVALID_DATA;
          }
          /* Some fonts handle the last segment incorrectly.  In */
          /* theory, 0xFFFF might point to an ordinary glyph --  */
          /* a cmap 4 is versatile and could be used for any     */
          /* encoding, not only Unicode.  However, reality shows */
          /* that far too many fonts are sloppy and incorrectly  */
          /* set all fields but `start' and `end' for the last   */
          /* segment if it contains only a single character.     */
          /*                                                     */
          /* We thus omit the test here, delaying it to the      */
          /* routines that actually access the cmap.             */
          else if ( n != num_segs - 1                       ||
                    !( start == 0xFFFFU && end == 0xFFFFU ) )
          {
            if ( p < glyph_ids                              ||
                 p + ( end - start + 1 ) * 2 > valid->limit )
              FT_INVALID_DATA;
          }

          /* check glyph indices within the segment range */
          if ( valid->level >= FT_VALIDATE_TIGHT )
          {
            FT_UInt  i, idx;


            for ( i = start; i < end; i++ )
            {
              idx = FT_NEXT_USHORT( p );
              if ( idx != 0 )
              {
                idx = (FT_UInt)( (FT_Int)idx + delta ) & 0xFFFFU;

                if ( idx >= TT_VALID_GLYPH_COUNT( valid ) )
                  FT_INVALID_GLYPH_ID;
              }
            }
          }
        }
        else if ( offset == 0xFFFFU )
        {
          /* some fonts (erroneously?) use a range offset of 0xFFFF */
          /* to mean missing glyph in cmap table                    */
          /*                                                        */
          if ( valid->level >= FT_VALIDATE_PARANOID    ||
               n != num_segs - 1                       ||
               !( start == 0xFFFFU && end == 0xFFFFU ) )
            FT_INVALID_DATA;
        }

        last_start = start;
        last_end   = end;
      }
    }

    return error;
  }